

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O0

wchar_t display_page(equippable_summary *s,player *p,_Bool allow_reconfig)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t y;
  wchar_t wVar3;
  int iVar4;
  wchar_t c;
  equippable *peVar5;
  wchar_t local_94;
  wchar_t koff;
  wchar_t k_1;
  wchar_t nmcolor;
  wchar_t j_1;
  wchar_t isort;
  wchar_t icnv;
  equippable *e;
  wchar_t k;
  wchar_t label_color;
  wchar_t joff;
  wchar_t j;
  int local_54;
  wchar_t local_50;
  wchar_t ilab;
  wchar_t i;
  wchar_t color;
  ui_entry_details rdetails;
  _Bool allow_reconfig_local;
  player *p_local;
  equippable_summary *s_local;
  
  rdetails.combined_position.y._3_1_ = allow_reconfig;
  unique0x1000077b = p;
  if ((allow_reconfig) && (wVar3 = reconfigure_for_term_if_necessary(true,p,s), wVar3 != L'\0')) {
    s_local._4_4_ = L'\x01';
  }
  else {
    i = s->icol_name + s->nshortnm + L'\x01';
    color = s->irow_combined_equip - s->nproplab;
    rdetails.label_position.y = s->irow_combined_equip;
    rdetails.label_position.x = i;
    rdetails.value_position = (loc_conflict)loc(1,0);
    rdetails.position_step = (loc_conflict)loc(0,0);
    rdetails.combined_position.x._0_1_ = 0;
    rdetails.combined_position.x._1_1_ = 0;
    rdetails.combined_position.x._3_1_ = 0;
    Term_putch(s->icol_name + L'\xfffffffc',rdetails.label_position.y,L'\x01',L'@');
    local_54 = 0;
    for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
      if (s->propcats[local_50].nvw[s->iview] != L'\0') {
        for (label_color = L'\0'; label_color < s->propcats[local_50].nvw[s->iview];
            label_color = label_color + L'\x01') {
          iVar4 = label_color + s->propcats[local_50].ivw[s->iview];
          wVar3 = L'\t';
          if (local_54 % 2 == 0) {
            wVar3 = L'\x01';
          }
          for (e._4_4_ = L'\0'; e._4_4_ < s->nproplab; e._4_4_ = e._4_4_ + L'\x01') {
            Term_putch(i,color + e._4_4_,wVar3,s->propcats[local_50].labels[iVar4][e._4_4_]);
          }
          rdetails.combined_position.x._2_1_ =
               is_ui_entry_for_known_rune
                         (s->propcats[local_50].entries[iVar4],stack0xffffffffffffffe0);
          wVar3 = get_ui_entry_renderer_index(s->propcats[local_50].entries[iVar4]);
          ui_entry_renderer_apply
                    (wVar3,(wchar_t *)0x0,L'\0',
                     s->p_and_eq_vals + (long)iVar4 + (long)s->propcats[local_50].off,
                     s->p_and_eq_auxvals + (long)iVar4 + (long)s->propcats[local_50].off,L'\x01',
                     (ui_entry_details *)&i);
          i = i + L'\x01';
          rdetails.label_position.x = rdetails.label_position.x + L'\x01';
          rdetails.combined_position.x._1_1_ = (rdetails.combined_position.x._1_1_ ^ 0xff) & 1;
          local_54 = local_54 + 1;
        }
      }
    }
    for (local_50 = L'\0'; rdetails.label_position.y = rdetails.label_position.y + L'\x01',
        local_50 < s->npage; local_50 = local_50 + L'\x01') {
      wVar3 = s->ifirst + s->indinc * local_50;
      if ((wVar3 < L'\0') || (s->nfilt <= wVar3)) {
        __assert_fail("icnv >= 0 && icnv < s->nfilt",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0xac7,
                      "int display_page(struct equippable_summary *, const struct player *, _Bool)")
        ;
      }
      wVar1 = s->sorted_indices[wVar3];
      if ((wVar1 < L'\0') || (s->nitems <= wVar1)) {
        __assert_fail("isort >= 0 && isort < s->nitems",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0xac9,
                      "int display_page(struct equippable_summary *, const struct player *, _Bool)")
        ;
      }
      peVar5 = s->items + wVar1;
      if ((tile_width == '\x01') && (tile_height == '\x01')) {
        Term_putch(s->icol_name + L'\xfffffffc',rdetails.label_position.y,(uint)peVar5->at,
                   peVar5->ch);
      }
      else {
        Term_putch(s->icol_name + L'\xfffffffc',rdetails.label_position.y,L'\x01',L' ');
      }
      y = rdetails.label_position.y;
      wVar2 = s->icol_name;
      c = source_to_char(peVar5->src);
      Term_putch(wVar2 + L'\xfffffffe',y,L'\x01',c);
      if (((wVar1 == s->isel0) || (wVar1 == s->isel1)) || (wVar3 == s->work_sel)) {
        koff = L'\x0e';
      }
      else {
        koff = L'\x01';
      }
      Term_putstr(s->icol_name,rdetails.label_position.y,peVar5->nmlen,koff,peVar5->short_name);
      rdetails.label_position.x = s->icol_name + s->nshortnm + L'\x01';
      rdetails.combined_position.x._1_1_ = 0;
      for (k_1 = L'\0'; k_1 < L'\x05'; k_1 = k_1 + L'\x01') {
        if (s->propcats[k_1].nvw[s->iview] != L'\0') {
          for (local_94 = L'\0'; local_94 < s->propcats[k_1].nvw[s->iview];
              local_94 = local_94 + L'\x01') {
            iVar4 = local_94 + s->propcats[k_1].ivw[s->iview];
            wVar3 = get_ui_entry_renderer_index(s->propcats[k_1].entries[iVar4]);
            ui_entry_renderer_apply
                      (wVar3,(wchar_t *)0x0,L'\0',
                       peVar5->vals + (long)iVar4 + (long)s->propcats[k_1].off,
                       peVar5->auxvals + (long)iVar4 + (long)s->propcats[k_1].off,L'\x01',
                       (ui_entry_details *)&i);
            rdetails.label_position.x = rdetails.label_position.x + L'\x01';
            rdetails.combined_position.x._1_1_ = (rdetails.combined_position.x._1_1_ ^ 0xff) & 1;
          }
        }
      }
    }
    s_local._4_4_ = L'\0';
  }
  return s_local._4_4_;
}

Assistant:

static int display_page(struct equippable_summary *s, const struct player *p,
	bool allow_reconfig)
{
	struct ui_entry_details rdetails;
	int color = (COLOUR_WHITE);
	int i, ilab;

	/* Try to handle terminal size changes while displaying the summary. */
	if (allow_reconfig) {
		if (reconfigure_for_term_if_necessary(true, p, s)) {
			return 1;
		}
	}

	/*
	 * Display the column labels and the combined values for @ and the
	 * current equipment.  The display of the labels bypasses what's
	 * done by ui_entry_renderer_apply() so the color of the label can
	 * alternate between columns.
	 */
	rdetails.label_position.x = s->icol_name + s->nshortnm + 1;
	rdetails.label_position.y = s->irow_combined_equip - s->nproplab;
	rdetails.value_position.x = rdetails.label_position.x;
	rdetails.value_position.y = s->irow_combined_equip;
	rdetails.position_step = loc(1, 0);
	rdetails.combined_position = loc(0, 0);
	rdetails.vertical_label = false;
	rdetails.alternate_color_first = false;
	rdetails.show_combined = false;
	Term_putch(s->icol_name - 4, rdetails.value_position.y, color, L'@');
	for (i = 0, ilab = 0; i < (int)N_ELEMENTS(s->propcats); ++i) {
		int j;

		if (!s->propcats[i].nvw[s->iview]) {
			continue;
		}
		for (j = 0; j < s->propcats[i].nvw[s->iview]; ++j, ++ilab) {
			int joff = j + s->propcats[i].ivw[s->iview];
			/*
			 * As a hack, label colors are hardwired; it would be
			 * better if they configurable so they'd be consistent
			 * with the scheme for the symbol colors.
			 */
			int label_color = (ilab % 2 == 0) ?
				COLOUR_WHITE : COLOUR_L_WHITE;
			int k;

			for (k = 0; k < s->nproplab; ++k) {
				Term_putch(rdetails.label_position.x,
					rdetails.label_position.y + k,
					label_color,
					s->propcats[i].labels[joff][k]);
			}
			rdetails.known_rune = is_ui_entry_for_known_rune(
				s->propcats[i].entries[joff], p);
			ui_entry_renderer_apply(get_ui_entry_renderer_index(
				s->propcats[i].entries[joff]), NULL, 0,
				s->p_and_eq_vals + joff + s->propcats[i].off,
				s->p_and_eq_auxvals + joff +
				s->propcats[i].off, 1, &rdetails);
			++rdetails.label_position.x;
			++rdetails.value_position.x;
			rdetails.alternate_color_first =
				!rdetails.alternate_color_first;
		}
	}

	/* Display the items available on the current page. */
	++rdetails.value_position.y;
	for (i = 0; i < s->npage; ++i) {
		const struct equippable *e;
		int icnv, isort, j, nmcolor;

		icnv = s->ifirst + s->indinc * i;
		assert(icnv >= 0 && icnv < s->nfilt);
		isort = s->sorted_indices[icnv];
		assert(isort >= 0 && isort < s->nitems);
		e = s->items + isort;

		if (tile_width == 1 && tile_height == 1) {
			Term_putch(s->icol_name - 4, rdetails.value_position.y,
				e->at, e->ch);
		} else {
			/* No equippy chars with big tiles. */
			Term_putch(s->icol_name - 4, rdetails.value_position.y,
				COLOUR_WHITE, L' ');
		}
		Term_putch(s->icol_name - 2, rdetails.value_position.y, color,
			source_to_char(e->src));
		if (isort == s->isel0 || isort == s->isel1 ||
			icnv == s->work_sel) {
			nmcolor = (COLOUR_L_BLUE);
		} else {
			nmcolor = color;
		}
		Term_putstr(s->icol_name, rdetails.value_position.y,
			e->nmlen, nmcolor, e->short_name);
		rdetails.value_position.x = s->icol_name + s->nshortnm + 1;
		rdetails.alternate_color_first = false;
		for (j = 0; j < (int)N_ELEMENTS(s->propcats); ++j) {
			int k;

			if (!s->propcats[j].nvw[s->iview]) {
				continue;
			}
			for (k = 0; k < s->propcats[j].nvw[s->iview]; ++k) {
				int koff = k + s->propcats[j].ivw[s->iview];

				ui_entry_renderer_apply(
					get_ui_entry_renderer_index(
					s->propcats[j].entries[koff]), NULL, 0,
					e->vals + koff + s->propcats[j].off,
					e->auxvals + koff + s->propcats[j].off,
					1, &rdetails);
				++rdetails.value_position.x;
				rdetails.alternate_color_first =
					!rdetails.alternate_color_first;
			}
		}
		++rdetails.value_position.y;
	}

	return 0;
}